

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O2

void skiwi::inline_fl_min(asmcode *code,compiler_options *param_2)

{
  skiwi *this;
  uint64_t in_RDX;
  operand oVar1;
  operand local_48;
  operand local_44;
  undefined8 local_40;
  operand local_34;
  string done;
  
  this = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,this,in_RDX);
  local_44 = AH;
  local_48 = RAX;
  local_34 = NUMBER;
  local_40 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_44,&local_48,&local_34,&local_40);
  local_44 = AH;
  local_48 = RBX;
  local_34 = NUMBER;
  local_40 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_44,&local_48,&local_34,&local_40);
  oVar1 = XMM0;
  local_40._0_4_ = MOVSD;
  local_48 = MEM_RAX;
  local_34 = DH;
  local_44 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_44,&local_48,(int *)&local_34);
  local_40._0_4_ = MOVSD;
  local_44 = XMM1;
  local_48 = MEM_RBX;
  local_34 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_44,&local_48,(int *)&local_34);
  local_40._0_4_ = UCOMISD;
  local_44 = XMM0;
  local_48 = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_44,&local_48);
  local_40._0_4_ = JBS;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_40,&done);
  local_40._0_4_ = MOVSD;
  local_48 = XMM1;
  local_44 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_44,&local_48);
  local_40._0_4_ = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_40,&done);
  local_40._0_4_ = MOV;
  local_44 = RAX;
  local_48 = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_44,&local_48);
  local_40._0_4_ = MOV;
  local_44 = MEM_RBP;
  local_48 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_44,&local_48);
  local_40._0_4_ = MOVSD;
  local_44 = MEM_RBP;
  local_48 = DH;
  local_34 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_44,(int *)&local_48,&local_34);
  local_40._0_4_ = MOV;
  local_44 = RAX;
  local_48 = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_44,&local_48);
  local_40._0_4_ = OR;
  local_44 = RAX;
  local_48 = NUMBER;
  local_34 = CL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_44,&local_48,(int *)&local_34);
  local_40 = (ulong)local_40._4_4_ << 0x20;
  local_44 = RBP;
  local_48 = NUMBER;
  local_34 = local_44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_44,&local_48,(int *)&local_34);
  std::__cxx11::string::~string((string *)&done);
  return;
}

Assistant:

void inline_fl_min(ASM::asmcode& code, const compiler_options&)
  {
  auto done = label_to_string(label++);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::UCOMISD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::JBS, done);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::LABEL, done);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVSD, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  }